

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIEnvironment::clear(CGUIEnvironment *this)

{
  long *plVar1;
  long *in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffe8;
  
  if (in_RDI[0x36] != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffe8);
    in_RDI[0x36] = 0;
  }
  if ((in_RDI[0x34] != 0) && ((long *)in_RDI[0x34] != in_RDI + 1)) {
    IReferenceCounted::drop(in_stack_ffffffffffffffe8);
    in_RDI[0x34] = 0;
  }
  if ((in_RDI[0x35] != 0) && ((long *)in_RDI[0x35] != in_RDI + 1)) {
    IReferenceCounted::drop(in_stack_ffffffffffffffe8);
    in_RDI[0x35] = 0;
  }
  plVar1 = (long *)(**(code **)(*in_RDI + 0xb0))();
  (**(code **)(*plVar1 + 0x40))();
  return;
}

Assistant:

void CGUIEnvironment::clear()
{
	// Remove the focus
	if (Focus) {
		Focus->drop();
		Focus = 0;
	}

	if (Hovered && Hovered != this) {
		Hovered->drop();
		Hovered = 0;
	}
	if (HoveredNoSubelement && HoveredNoSubelement != this) {
		HoveredNoSubelement->drop();
		HoveredNoSubelement = 0;
	}

	getRootGUIElement()->removeAllChildren();
}